

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

fdb_status sb_read_latest(filemgr *file,sb_config sconfig,err_log_callback *log_callback)

{
  long lVar1;
  fdb_status fVar2;
  uint64_t uVar3;
  uint64_t *__s;
  void *pvVar4;
  fdb_log_callback p_Var5;
  undefined8 in_stack_ffffffffffffff98;
  atomic<unsigned_long> *in_stack_ffffffffffffffa0;
  uint64_t cur_revnum;
  superblock *sb_arr;
  ulong uStack_40;
  fdb_status fs;
  uint64_t revnum_limit;
  uint64_t max_revnum;
  size_t max_sb_no;
  size_t i;
  err_log_callback *log_callback_local;
  filemgr *file_local;
  sb_config sconfig_local;
  
  max_revnum = (uint64_t)sconfig.num_sb;
  revnum_limit = 0;
  uStack_40 = 0xffffffffffffffff;
  i = (size_t)log_callback;
  log_callback_local = (err_log_callback *)file;
  file_local._3_1_ = sconfig.num_sb;
  if (file->sb != (superblock *)0x0) {
    uVar3 = atomic_get_uint64_t(in_stack_ffffffffffffffa0,
                                (memory_order)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    uStack_40 = uVar3 - 1;
    sb_free((filemgr *)0x18b856);
  }
  lVar1 = -(ulong)((uint)file_local._3_1_ * 40000);
  __s = (uint64_t *)(&stack0xffffffffffffff98 + lVar1);
  *(undefined8 *)(&stack0xffffffffffffff90 + lVar1) = 0x18b885;
  memset(__s,0,(ulong)file_local._3_1_ * 200);
  for (max_sb_no = 0; max_sb_no < file_local._3_1_; max_sb_no = max_sb_no + 1) {
    *(undefined8 *)(&stack0xffffffffffffff90 + lVar1) = 0x18b8ab;
    pvVar4 = calloc(1,1);
    __s[max_sb_no * 0x19] = (uint64_t)pvVar4;
    *(undefined8 *)(&stack0xffffffffffffff90 + lVar1) = 0x18b8de;
    _sb_init((superblock *)*__s,(sb_config)(&stack0xffffffffffffffa7)[lVar1]);
    *(undefined8 *)(&stack0xffffffffffffff90 + lVar1) = 0x18b8fe;
    fVar2 = _sb_read_given_no(*(filemgr **)(&stack0x000002b8 + lVar1),
                              *(size_t *)(&stack0x000002b0 + lVar1),
                              *(superblock **)(&stack0x000002a8 + lVar1),
                              *(err_log_callback **)(&stack0x000002a0 + lVar1));
    *(undefined8 *)(&stack0xffffffffffffff90 + lVar1) = 0x18b91e;
    uVar3 = atomic_get_uint64_t(*(atomic<unsigned_long> **)(&stack0xffffffffffffffa0 + lVar1),
                                *(memory_order *)(&stack0xffffffffffffff9c + lVar1));
    if (((fVar2 == FDB_RESULT_SUCCESS) && (revnum_limit <= uVar3)) && (uVar3 < uStack_40)) {
      max_revnum = max_sb_no;
      revnum_limit = uVar3;
    }
  }
  if (max_revnum == file_local._3_1_) {
    for (max_sb_no = 0; max_sb_no < file_local._3_1_; max_sb_no = max_sb_no + 1) {
      *(undefined8 *)(&stack0xffffffffffffff90 + lVar1) = 0x18b99c;
      _sb_free(*(superblock **)(&stack0xffffffffffffff90 + lVar1));
    }
    file_local._4_4_ = FDB_RESULT_SB_READ_FAIL;
  }
  else {
    *(undefined8 *)(&stack0xffffffffffffff90 + lVar1) = 0x18b9c4;
    p_Var5 = (fdb_log_callback)calloc(1,200);
    log_callback_local[0x11].callback = p_Var5;
    *(undefined8 *)(&stack0xffffffffffffff90 + lVar1) = 0x18b9f1;
    _sb_copy(*(superblock **)((long)&i + lVar1),*(superblock **)((long)&max_sb_no + lVar1));
    *(undefined8 *)(&stack0xffffffffffffff90 + lVar1) = 0x18ba0d;
    uVar3 = atomic_get_uint64_t(*(atomic<unsigned_long> **)(&stack0xffffffffffffffa0 + lVar1),
                                *(memory_order *)(&stack0xffffffffffffff9c + lVar1));
    if (uVar3 != 0xffffffffffffffff) {
      *(undefined8 *)(&stack0xffffffffffffff90 + lVar1) = 0x18ba3b;
      atomic_get_uint64_t(*(atomic<unsigned_long> **)(&stack0xffffffffffffffa0 + lVar1),
                          *(memory_order *)(&stack0xffffffffffffff9c + lVar1));
      *(undefined8 *)(&stack0xffffffffffffff90 + lVar1) = 0x18ba5e;
      atomic_store_uint64_t
                (*(atomic<unsigned_long> **)(&stack0xffffffffffffffa0 + lVar1),*__s,
                 *(memory_order *)(&stack0xffffffffffffff94 + lVar1));
    }
    *(undefined8 *)(&stack0xffffffffffffff90 + lVar1) = 0x18ba7b;
    atomic_incr_uint64_t
              (*(atomic<unsigned_long> **)(&stack0xffffffffffffffa0 + lVar1),
               *(memory_order *)(&stack0xffffffffffffff9c + lVar1));
    p_Var5 = log_callback_local[0x11].callback;
    *(undefined8 *)(&stack0xffffffffffffff90 + lVar1) = 0x18ba93;
    avl_init((avl_tree *)(p_Var5 + 0x50),(void *)0x0);
    for (max_sb_no = 0; max_sb_no < file_local._3_1_; max_sb_no = max_sb_no + 1) {
      if (max_sb_no != max_revnum) {
        *(undefined8 *)(&stack0xffffffffffffff90 + lVar1) = 0x18bac6;
        _sb_free(*(superblock **)(&stack0xffffffffffffff90 + lVar1));
      }
    }
    file_local._4_4_ = FDB_RESULT_SUCCESS;
  }
  return file_local._4_4_;
}

Assistant:

fdb_status sb_read_latest(struct filemgr *file,
                          struct sb_config sconfig,
                          err_log_callback *log_callback)
{
    size_t i, max_sb_no = sconfig.num_sb;
    uint64_t max_revnum = 0;
    uint64_t revnum_limit = (uint64_t)0xffffffffffffffff;
    fdb_status fs;
    struct superblock *sb_arr;

    if (file->sb) {
        // Superblock is already read previously.
        // This means that there are some problems with the current superblock
        // so that we have to read another candidate.

        // Note: 'sb->revnum' denotes the revnum of next superblock to be
        // written, so we need to subtract 1 from it to get the revnum of
        // the current superblock successfully read from the file.
        revnum_limit = atomic_get_uint64_t(&file->sb->revnum) - 1;
        sb_free(file);
    }

    sb_arr = alca(struct superblock,
                  sconfig.num_sb * sizeof(struct superblock));
    memset(sb_arr, 0x0, sconfig.num_sb * sizeof(struct superblock));

    // read all superblocks
    for (i=0; i<sconfig.num_sb; ++i) {
        sb_arr[i].config = (struct sb_config*)calloc(1, sizeof(struct sb_config));
        _sb_init(&sb_arr[i], sconfig);
        fs = _sb_read_given_no(file, i, &sb_arr[i], log_callback);

        uint64_t cur_revnum = atomic_get_uint64_t(&sb_arr[i].revnum);
        if (fs == FDB_RESULT_SUCCESS &&
            cur_revnum >= max_revnum &&
            cur_revnum < revnum_limit) {
            max_sb_no = i;
            max_revnum = cur_revnum;
        }
    }

    if (max_sb_no == sconfig.num_sb) {
        // all superblocks are broken
        fs = FDB_RESULT_SB_READ_FAIL;
        for (i=0; i<sconfig.num_sb; ++i) {
            _sb_free(&sb_arr[i]);
        }
        // no readable superblock
        // (if not corrupted, it may be a normal old version file)
        return fs;
    }

    file->sb = (struct superblock*)calloc(1, sizeof(struct superblock));
    _sb_copy(file->sb, &sb_arr[max_sb_no]);

    // set last commit position
    if (atomic_get_uint64_t(&file->sb->cur_alloc_bid) != BLK_NOT_FOUND) {
        atomic_store_uint64_t(&file->last_commit,
                              atomic_get_uint64_t(&file->sb->cur_alloc_bid) *
                              file->config->blocksize);
    } else {
        // otherwise, last_commit == file->pos
        // (already set by filemgr_open() function)
    }

    atomic_incr_uint64_t(&file->sb->revnum);
    avl_init(&file->sb->bmp_idx, NULL);

    // free the other superblocks
    for (i=0; i<sconfig.num_sb; ++i) {
        if (i != max_sb_no) {
            _sb_free(&sb_arr[i]);
        }
    }

    return FDB_RESULT_SUCCESS;
}